

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void par_shapes_merge_and_free(par_shapes_mesh *dst,par_shapes_mesh *src)

{
  par_shapes_mesh *src_local;
  par_shapes_mesh *dst_local;
  
  par_shapes_merge(dst,src);
  par_shapes_free_mesh(src);
  return;
}

Assistant:

PARDEF void par_shapes_merge_and_free(par_shapes_mesh* dst, par_shapes_mesh* src)
{
    par_shapes_merge(dst, src);
    par_shapes_free_mesh(src);
}